

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

string * __thiscall
llvm::APInt::toString_abi_cxx11_(string *__return_storage_ptr__,APInt *this,uint Radix,bool Signed)

{
  SmallString<40U> S;
  SmallVectorImpl<char> local_50;
  undefined1 local_40 [40];
  
  local_50.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_50.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x28;
  local_50.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_40;
  toString(this,&local_50,Radix,Signed,false);
  if ((undefined1 *)
      local_50.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX == (undefined1 *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               local_50.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
               (undefined1 *)
               ((long)local_50.super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
               (local_50.super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff
               )));
  }
  if ((undefined1 *)
      local_50.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_40) {
    free(local_50.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string APInt::toString(unsigned Radix = 10, bool Signed = true) const {
  SmallString<40> S;
  toString(S, Radix, Signed, /* formatAsCLiteral = */false);
  return S.str();
}